

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQChar * __thiscall SQLexer::Tok2Str(SQLexer *this,SQInteger tok)

{
  SQInteger x;
  _HashNode **pp_Var1;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr itr;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_60.super_SQObject._type = OT_NULL;
  local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pp_Var1 = (_HashNode **)0x0;
  do {
    x = SQTable::Next(this->_keywords,false,&local_40,&local_50,&local_60);
    if (x == -1) goto LAB_0012266f;
    SQObjectPtr::operator=(&local_40,x);
  } while (local_60.super_SQObject._unVal.pTable != (SQTable *)tok);
  pp_Var1 = &(local_50.super_SQObject._unVal.pTable)->_firstfree;
LAB_0012266f:
  SQObjectPtr::~SQObjectPtr(&local_60);
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_40);
  return (SQChar *)pp_Var1;
}

Assistant:

const SQChar *SQLexer::Tok2Str(SQInteger tok)
{
    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = _keywords->Next(false,itr, key, val)) != -1) {
        itr = (SQInteger)nitr;
        if(((SQInteger)_integer(val)) == tok)
            return _stringval(key);
    }
    return NULL;
}